

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_blake256.c
# Opt level: O2

void hmac_blake224_init(hmac_state *S,uint8_t *_key,uint64_t keylen)

{
  uint64_t uVar1;
  uint8_t *out;
  uint8_t pad [64];
  uint8_t local_48 [40];
  
  out = _key;
  if (0x40 < keylen) {
    out = local_48;
    blake256_hash(out,_key,keylen);
    keylen = 0x1c;
  }
  blake224_init(&S->inner);
  builtin_memcpy(pad + 0x30,"6666666666666666",0x10);
  builtin_memcpy(pad + 0x20,"6666666666666666",0x10);
  builtin_memcpy(pad + 0x10,"6666666666666666",0x10);
  builtin_memcpy(pad,"6666666666666666",0x10);
  for (uVar1 = 0; keylen != uVar1; uVar1 = uVar1 + 1) {
    pad[uVar1] = pad[uVar1] ^ out[uVar1];
  }
  blake256_update(&S->inner,pad,0x200);
  blake224_init(&S->outer);
  builtin_memcpy(pad + 0x30,"\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\",0x10);
  builtin_memcpy(pad + 0x20,"\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\",0x10);
  builtin_memcpy(pad + 0x10,"\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\",0x10);
  builtin_memcpy(pad,"\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\",0x10);
  for (uVar1 = 0; keylen != uVar1; uVar1 = uVar1 + 1) {
    pad[uVar1] = pad[uVar1] ^ out[uVar1];
  }
  blake256_update(&S->outer,pad,0x200);
  return;
}

Assistant:

void hmac_blake224_init(hmac_state *S, const uint8_t *_key, uint64_t keylen) {
    const uint8_t *key = _key;
    uint8_t keyhash[32];
    uint8_t pad[64];
    uint64_t i;

    if (keylen > 64) {
        blake256_hash(keyhash, key, keylen);
        key = keyhash;
        keylen = 28;
    }

    blake224_init(&S->inner);
    memset(pad, 0x36, 64);
    for (i = 0; i < keylen; ++i) {
        pad[i] ^= key[i];
    }
    blake224_update(&S->inner, pad, 512);

    blake224_init(&S->outer);
    memset(pad, 0x5c, 64);
    for (i = 0; i < keylen; ++i) {
        pad[i] ^= key[i];
    }
    blake224_update(&S->outer, pad, 512);

    memset(keyhash, 0, 32);
}